

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.h
# Opt level: O2

void __thiscall submitter::operator()(submitter *this)

{
  function *pfVar1;
  _Function_base _Stack_58;
  undefined1 local_38 [40];
  
  pfVar1 = (function *)cppcms::service::thread_pool();
  runner::runner((runner *)local_38,this->srv_);
  std::function<void()>::function<runner,void>((function<void()> *)&_Stack_58,(runner *)local_38);
  cppcms::thread_pool::post(pfVar1);
  std::_Function_base::~_Function_base(&_Stack_58);
  std::__cxx11::string::~string((string *)(local_38 + 8));
  return;
}

Assistant:

void operator()() const
	{
		srv_->thread_pool().post(runner(*srv_));
	}